

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_substring(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                   lyxp_set *set,int options)

{
  unkuint10 Var1;
  int iVar2;
  uint uVar3;
  ushort uStack_70;
  short sStack_60;
  ushort uStack_50;
  ushort local_4a;
  uint16_t local_48;
  ushort local_46;
  int iStack_44;
  uint16_t pos;
  uint16_t str_len;
  uint16_t str_start;
  int len;
  int start;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t arg_count_local;
  lyxp_set **args_local;
  
  iVar2 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  if (iVar2 == 0) {
    iVar2 = xpath_round(args + 1,1,cur_node,param_4,args[1],options);
    if (iVar2 == 0) {
      Var1 = *(unkuint10 *)&args[1]->val;
      uStack_50 = (ushort)(Var1 >> 0x40);
      if ((Var1 & 0x7fff) == 0 ||
          ((ushort)((uStack_50 & 0x7fff) - 1) < 0x7ffe & (byte)(Var1 >> 0x38) >> 7) != 0) {
        _str_len = (int)ROUND(-(longdouble)1 + (args[1]->val).num);
      }
      else {
        sStack_60 = (short)((unkuint10)(args[1]->val).num >> 0x40);
        uVar3 = 0;
        if ((longdouble)INFINITY <= ABS((args[1]->val).num)) {
          uVar3 = (uint)((ulong)(long)sStack_60 >> 0xf) | 1;
        }
        if ((uVar3 == 0) || (-1 < *(short *)((long)&args[1]->val + 8))) {
          _str_len = 0x7fffffff;
        }
        else {
          _str_len = -0x80000000;
        }
      }
      if (arg_count == 3) {
        iVar2 = xpath_round(args + 2,1,cur_node,param_4,args[2],options);
        if (iVar2 != 0) {
          return -1;
        }
        Var1 = *(unkuint10 *)&args[2]->val;
        uStack_70 = (ushort)(Var1 >> 0x40);
        if ((Var1 & 0x7fff) == 0 ||
            ((ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe & (byte)(Var1 >> 0x38) >> 7) != 0) {
          iStack_44 = (int)ROUND((args[2]->val).num);
        }
        else if ((NAN((args[2]->val).num)) || (*(short *)((long)&args[2]->val + 8) < 0)) {
          iStack_44 = 0;
        }
        else {
          iStack_44 = 0x7fffffff;
        }
      }
      else {
        iStack_44 = 0x7fffffff;
      }
      local_46 = 0;
      local_48 = 0;
      for (local_4a = 0; *(char *)((long)&(((*args)->val).nodes)->node + (ulong)local_4a) != '\0';
          local_4a = local_4a + 1) {
        if ((int)(uint)local_4a < _str_len) {
          local_46 = local_46 + 1;
        }
        else {
          if (_str_len + iStack_44 <= (int)(uint)local_4a) break;
          local_48 = local_48 + 1;
        }
      }
      set_fill_string(set,(char *)((long)&(((*args)->val).nodes)->node + (long)(int)(uint)local_46),
                      local_48);
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = -1;
    }
  }
  else {
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_substring(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                struct lyxp_set *set, int options)
{
    int start, len;
    uint16_t str_start, str_len, pos;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* start */
    if (xpath_round(&args[1], 1, cur_node, local_mod, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT_MIN;
    } else {
        start = INT_MAX;
    }

    /* len */
    if (arg_count == 3) {
        if (xpath_round(&args[2], 1, cur_node, local_mod, args[2], options)) {
            return -1;
        }
        if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else {
            len = INT_MAX;
        }
    } else {
        len = INT_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return EXIT_SUCCESS;
}